

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O0

Animation *
rw::Animation::create(AnimInterpolatorInfo *interpInfo,int32 numFrames,int32 flags,float duration)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  Animation *anim;
  Error _e;
  uint8 *data;
  int32 sz;
  float duration_local;
  int32 flags_local;
  int32 numFrames_local;
  AnimInterpolatorInfo *interpInfo_local;
  
  uVar1 = numFrames * interpInfo->animKeyFrameSize + 0x28 + interpInfo->customDataSize;
  _e = (Error)malloc_LOC((long)(int)uVar1,0x3001b,
                         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/anim.cpp line: 70"
                        );
  if (_e == (Error)0x0) {
    anim._0_4_ = 0x1b;
    anim._4_4_ = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/anim.cpp",
            0x48);
    __stream = _stderr;
    pcVar2 = dbgsprint(0x80000002,(ulong)uVar1);
    fprintf(__stream,"%s\n",pcVar2);
    setError((Error *)&anim);
    interpInfo_local = (AnimInterpolatorInfo *)0x0;
  }
  else {
    *(AnimInterpolatorInfo **)_e = interpInfo;
    *(int32 *)((long)_e + 8) = numFrames;
    *(int32 *)((long)_e + 0xc) = flags;
    *(float *)((long)_e + 0x10) = duration;
    *(undefined8 **)((long)_e + 0x18) = (undefined8 *)((long)_e + 0x28);
    *(long *)((long)_e + 0x20) =
         (long)_e + 0x28 + (long)(*(int *)((long)_e + 8) * interpInfo->animKeyFrameSize);
    interpInfo_local = (AnimInterpolatorInfo *)_e;
  }
  return (Animation *)interpInfo_local;
}

Assistant:

Animation*
Animation::create(AnimInterpolatorInfo *interpInfo, int32 numFrames,
                  int32 flags, float duration)
{
	int32 sz = sizeof(Animation) +
	           numFrames*interpInfo->animKeyFrameSize +
	           interpInfo->customDataSize;
	uint8 *data = (uint8*)rwMalloc(sz, MEMDUR_EVENT | ID_ANIMANIMATION);
	if(data == nil){
		RWERROR((ERR_ALLOC, sz));
		return nil;
	}
	Animation *anim = (Animation*)data;
	data += sizeof(Animation);
	anim->interpInfo = interpInfo;
	anim->numFrames = numFrames;
	anim->flags = flags;
	anim->duration = duration;
	anim->keyframes = data;
	data += anim->numFrames*interpInfo->animKeyFrameSize;
	anim->customData = data;
	return anim;
}